

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O2

void __thiscall SpinLock::Unlock(SpinLock *this)

{
  int iVar1;
  
  LOCK();
  iVar1 = (this->lockword_).super___atomic_base<int>._M_i;
  (this->lockword_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  if (iVar1 == 1) {
    return;
  }
  SlowUnlock(this);
  return;
}

Assistant:

void Unlock() UNLOCK_FUNCTION() {
    int prev_value = lockword_.exchange(kSpinLockFree, std::memory_order_release);
    if (prev_value != kSpinLockHeld) {
      // Speed the wakeup of any waiter.
      SlowUnlock();
    }
  }